

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O0

void Lf_ObjMergeOrder(Lf_Man_t *p,int iObj)

{
  float fVar1;
  int nCutNum_00;
  int n_00;
  int iVar2;
  int fCompl1;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  Gia_Obj_t *pObj_00;
  Lf_Bst_t *p_00;
  Gia_Obj_t *pObj_01;
  word wVar10;
  word *pwVar11;
  Lf_Cut_t *pCut;
  float FlowRefs_00;
  int local_bd8;
  int fIsXor;
  int nCuts2;
  int fComp2;
  Lf_Cut_t *pCutSave;
  int nCutsE;
  int fCompE;
  Gia_Obj_t *pObjE;
  float Value2;
  float Value1;
  int nCutsR;
  int iCutUsed;
  int n;
  int k;
  int i;
  int iSibl;
  int nCuts1;
  int nCuts0;
  int fComp1;
  int fComp0;
  int nCutWords;
  int nCutNum;
  int nLutSize;
  int Required;
  float FlowRefs;
  Lf_Bst_t *pBest;
  Gia_Obj_t *pObj;
  Lf_Cut_t *pCutsR [32];
  Lf_Cut_t *pCutSet;
  Lf_Cut_t *pCut2;
  Lf_Cut_t *pCut1;
  Lf_Cut_t *pCut0;
  Lf_Cut_t *pCutSet2;
  Lf_Cut_t *pCutSet1;
  Lf_Cut_t *pCutSet0;
  word CutSet [32] [10];
  int iObj_local;
  Lf_Man_t *p_local;
  
  CutSet[0x1f][9]._4_4_ = iObj;
  memset(&pCutSet0,0,0xa00);
  pCut1 = (Lf_Cut_t *)&pCutSet0;
  pObj_00 = Gia_ManObj(p->pGia,CutSet[0x1f][9]._4_4_);
  p_00 = Lf_ObjReadBest(p,CutSet[0x1f][9]._4_4_);
  FlowRefs_00 = Lf_ObjFlowRefs(p,CutSet[0x1f][9]._4_4_);
  nCutNum = Lf_ObjRequired(p,CutSet[0x1f][9]._4_4_);
  if (p->pPars->fCutGroup == 0) {
    local_bd8 = p->pPars->nLutSize;
  }
  else {
    local_bd8 = p->pPars->nLutSize / 2;
  }
  nCutNum_00 = p->pPars->nCutNum;
  n_00 = p->nCutWords;
  iVar2 = Gia_ObjFaninC0(pObj_00);
  fCompl1 = Gia_ObjFaninC1(pObj_00);
  iVar3 = Gia_ObjFaninId0(pObj_00,CutSet[0x1f][9]._4_4_);
  iVar3 = Lf_ManPrepareSet(p,iVar3,0,&pCutSet1);
  iVar4 = Gia_ObjFaninId1(pObj_00,CutSet[0x1f][9]._4_4_);
  iVar4 = Lf_ManPrepareSet(p,iVar4,1,&pCutSet2);
  iVar5 = Gia_ObjSibl(p->pGia,CutSet[0x1f][9]._4_4_);
  Value2 = 0.0;
  iVar6 = Gia_ObjIsBuf(pObj_00);
  if (iVar6 != 0) {
    __assert_fail("!Gia_ObjIsBuf(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                  ,0x4b5,"void Lf_ObjMergeOrder(Lf_Man_t *, int)");
  }
  for (n = 0; n < nCutNum_00; n = n + 1) {
    pCutsR[(long)n + -1] = pCut1;
    pCut1 = Lf_CutNext(pCut1,n_00);
  }
  if (p->Iter != 0) {
    Lf_MemLoadCut(&p->vStoreOld,(uint)p_00->Cut[0] >> 1,CutSet[0x1f][9]._4_4_,(Lf_Cut_t *)pObj,
                  p->pPars->fCutMin,1);
    iVar6 = Lf_BestDiffCuts(p_00);
    if (iVar6 != 0) {
      Lf_MemLoadCut(&p->vStoreOld,(uint)p_00->Cut[1] >> 1,CutSet[0x1f][9]._4_4_,pCutsR[0],
                    p->pPars->fCutMin,1);
    }
    if ((p->fUseEla != 0) && (iVar6 = Lf_ObjMapRefNum(p,CutSet[0x1f][9]._4_4_), 0 < iVar6)) {
      iVar6 = Lf_BestIndex(p_00);
      Lf_CutDeref_rec(p,pCutsR[(long)iVar6 + -1]);
    }
    if (nCutNum == 1000000000) {
      nCutNum = Lf_CutRequired(p,(Lf_Cut_t *)pObj);
    }
    Value2 = 1.4013e-45;
    Lf_CutParams(p,(Lf_Cut_t *)pObj,nCutNum,FlowRefs_00,pObj_00);
    iVar6 = Lf_BestDiffCuts(p_00);
    if (iVar6 != 0) {
      Lf_CutParams(p,pCutsR[0],nCutNum,FlowRefs_00,pObj_00);
      Value2 = (float)Lf_SetAddCut((Lf_Cut_t **)&pObj,1,nCutNum_00);
    }
    if ((pObj[1].Value >> 0x16 & 1) != 0) {
      p->nTimeFails = p->nTimeFails + 1;
    }
  }
  if (iVar5 != 0) {
    pObj_01 = Gia_ObjSiblObj(p->pGia,CutSet[0x1f][9]._4_4_);
    uVar7 = Gia_ObjPhase(pObj_00);
    uVar8 = Gia_ObjPhase(pObj_01);
    iVar6 = Lf_ManPrepareSet(p,iVar5,2,&pCut0);
    pCutSet = pCut0;
    for (nCutsR = 0; nCutsR < iVar6; nCutsR = nCutsR + 1) {
      if ((int)pCutSet[1].Sign != iVar5) {
        Lf_CutCopy(pCutsR[(long)(int)Value2 + -1],pCutSet,n_00);
        if (-1 < pCutsR[(long)(int)Value2 + -1]->iFunc) {
          iVar9 = Abc_LitNotCond(pCutsR[(long)(int)Value2 + -1]->iFunc,uVar7 ^ uVar8);
          pCutsR[(long)(int)Value2 + -1]->iFunc = iVar9;
        }
        Lf_CutParams(p,pCutsR[(long)(int)Value2 + -1],nCutNum,FlowRefs_00,pObj_00);
        Value2 = (float)Lf_SetAddCut((Lf_Cut_t **)&pObj,(int)Value2,nCutNum_00);
      }
      pCutSet = Lf_CutNext(pCutSet,n_00);
    }
  }
  iVar5 = Gia_ObjIsMuxId(p->pGia,CutSet[0x1f][9]._4_4_);
  if (iVar5 == 0) {
    iVar5 = Gia_ObjIsXor(pObj_00);
    p->CutCount[0] = (double)(iVar3 * iVar4) + p->CutCount[0];
    pCut1 = pCutSet1;
    for (n = 0; n < iVar3; n = n + 1) {
      if ((int)(*(uint *)&pCut1->field_0x14 >> 0x18) <= local_bd8) {
        pCut2 = pCutSet2;
        for (iCutUsed = 0; iCutUsed < iVar4; iCutUsed = iCutUsed + 1) {
          if (((int)(*(uint *)&pCut2->field_0x14 >> 0x18) <= local_bd8) &&
             (((int)((*(uint *)&pCut1->field_0x14 >> 0x18) + (*(uint *)&pCut2->field_0x14 >> 0x18))
               <= local_bd8 ||
              (iVar6 = Lf_CutCountBits(pCut1->Sign | pCut2->Sign), iVar6 <= local_bd8)))) {
            p->CutCount[1] = p->CutCount[1] + 1.0;
            iVar6 = Lf_CutMergeOrder(pCut1,pCut2,pCutsR[(long)(int)Value2 + -1],local_bd8);
            if ((iVar6 != 0) &&
               (iVar6 = Lf_SetLastCutIsContained((Lf_Cut_t **)&pObj,(int)Value2), iVar6 == 0)) {
              p->CutCount[2] = p->CutCount[2] + 1.0;
              if ((p->pPars->fCutMin != 0) &&
                 (iVar6 = Lf_CutComputeTruth(p,pCut1,pCut2,iVar2,fCompl1,
                                             pCutsR[(long)(int)Value2 + -1],iVar5), iVar6 != 0)) {
                wVar10 = Lf_CutGetSign(pCutsR[(long)(int)Value2 + -1]);
                pCutsR[(long)(int)Value2 + -1]->Sign = wVar10;
              }
              if ((p->pPars->nLutSizeMux != 0) &&
                 (p->pPars->nLutSizeMux ==
                  *(uint *)&pCutsR[(long)(int)Value2 + -1]->field_0x14 >> 0x18)) {
                pwVar11 = Lf_CutTruth(p,pCutsR[(long)(int)Value2 + -1]);
                iVar6 = Abc_Truth6WordNum(local_bd8);
                iVar6 = Lf_ManFindCofVar(pwVar11,iVar6,
                                         *(uint *)&pCutsR[(long)(int)Value2 + -1]->field_0x14 >>
                                         0x18);
                if (iVar6 == -1) goto LAB_0093e6a0;
              }
              Lf_CutParams(p,pCutsR[(long)(int)Value2 + -1],nCutNum,FlowRefs_00,pObj_00);
              Value2 = (float)Lf_SetAddCut((Lf_Cut_t **)&pObj,(int)Value2,nCutNum_00);
            }
          }
LAB_0093e6a0:
          pCut2 = Lf_CutNext(pCut2,n_00);
        }
      }
      pCut1 = Lf_CutNext(pCut1,n_00);
    }
  }
  else {
    _nCuts2 = (Lf_Cut_t *)0x0;
    iVar5 = Gia_ObjFaninC2(p->pGia,pObj_00);
    iVar6 = Gia_ObjFaninId2(p->pGia,CutSet[0x1f][9]._4_4_);
    iVar6 = Lf_ManPrepareSet(p,iVar6,2,&pCut0);
    p->CutCount[0] = (double)(iVar3 * iVar4 * iVar6) + p->CutCount[0];
    pCut1 = pCutSet1;
    for (n = 0; n < iVar3; n = n + 1) {
      if ((int)(*(uint *)&pCut1->field_0x14 >> 0x18) <= local_bd8) {
        pCut2 = pCutSet2;
        for (iCutUsed = 0; iCutUsed < iVar4; iCutUsed = iCutUsed + 1) {
          if ((int)(*(uint *)&pCut2->field_0x14 >> 0x18) <= local_bd8) {
            pCutSet = pCut0;
            for (nCutsR = 0; nCutsR < iVar6; nCutsR = nCutsR + 1) {
              if ((int)(*(uint *)&pCutSet->field_0x14 >> 0x18) <= local_bd8) {
                _nCuts2 = pCutSet;
                iVar9 = Lf_CutCountBits(pCut1->Sign | pCut2->Sign | pCutSet->Sign);
                if (iVar9 <= local_bd8) {
                  p->CutCount[1] = p->CutCount[1] + 1.0;
                  iVar9 = Lf_CutMergeOrderMux(pCut1,pCut2,pCutSet,pCutsR[(long)(int)Value2 + -1],
                                              local_bd8);
                  if ((iVar9 != 0) &&
                     (iVar9 = Lf_SetLastCutIsContained((Lf_Cut_t **)&pObj,(int)Value2), iVar9 == 0))
                  {
                    p->CutCount[2] = p->CutCount[2] + 1.0;
                    if ((p->pPars->fCutMin != 0) &&
                       (iVar9 = Lf_CutComputeTruthMux
                                          (p,pCut1,pCut2,pCutSet,iVar2,fCompl1,iVar5,
                                           pCutsR[(long)(int)Value2 + -1]), iVar9 != 0)) {
                      wVar10 = Lf_CutGetSign(pCutsR[(long)(int)Value2 + -1]);
                      pCutsR[(long)(int)Value2 + -1]->Sign = wVar10;
                    }
                    if ((p->pPars->nLutSizeMux != 0) &&
                       (p->pPars->nLutSizeMux ==
                        *(uint *)&pCutsR[(long)(int)Value2 + -1]->field_0x14 >> 0x18)) {
                      pwVar11 = Lf_CutTruth(p,pCutsR[(long)(int)Value2 + -1]);
                      iVar9 = Abc_Truth6WordNum(local_bd8);
                      iVar9 = Lf_ManFindCofVar(pwVar11,iVar9,
                                               *(uint *)&pCutsR[(long)(int)Value2 + -1]->field_0x14
                                               >> 0x18);
                      if (iVar9 == -1) goto LAB_0093e002;
                    }
                    Lf_CutParams(p,pCutsR[(long)(int)Value2 + -1],nCutNum,FlowRefs_00,pObj_00);
                    Value2 = (float)Lf_SetAddCut((Lf_Cut_t **)&pObj,(int)Value2,nCutNum_00);
                  }
                }
              }
LAB_0093e002:
              pCutSet = Lf_CutNext(pCutSet,n_00);
            }
          }
          pCut2 = Lf_CutNext(pCut2,n_00);
        }
      }
      pCut1 = Lf_CutNext(pCut1,n_00);
    }
    if (p->pPars->fCutGroup != 0) {
      if (*(uint *)&_nCuts2->field_0x14 >> 0x18 != 1) {
        __assert_fail("pCutSave->nLeaves == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                      ,0x4fd,"void Lf_ObjMergeOrder(Lf_Man_t *, int)");
      }
      wVar10 = _nCuts2[1].Sign;
      iVar6 = Gia_ObjFaninId2(p->pGia,CutSet[0x1f][9]._4_4_);
      if ((int)wVar10 != iVar6) {
        __assert_fail("pCutSave->pLeaves[0] == Gia_ObjFaninId2(p->pGia, iObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                      ,0x4fe,"void Lf_ObjMergeOrder(Lf_Man_t *, int)");
      }
      pCut1 = pCutSet1;
      for (n = 0; n < iVar3; n = n + 1) {
        if ((int)(*(uint *)&pCut1->field_0x14 >> 0x18) <= local_bd8) {
          pCut2 = pCutSet2;
          for (iCutUsed = 0; iCutUsed < iVar4; iCutUsed = iCutUsed + 1) {
            if ((int)(*(uint *)&pCut2->field_0x14 >> 0x18) <= local_bd8) {
              if (p->pPars->nLutSize <
                  (int)((*(uint *)&pCut1->field_0x14 >> 0x18) +
                        (*(uint *)&pCut2->field_0x14 >> 0x18) + 1)) {
                __assert_fail("(int)pCut0->nLeaves + (int)pCut1->nLeaves + 1 <= p->pPars->nLutSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                              ,0x502,"void Lf_ObjMergeOrder(Lf_Man_t *, int)");
              }
              p->CutCount[1] = p->CutCount[1] + 1.0;
              iVar6 = Lf_CutMergeOrderMux(pCut1,pCut2,_nCuts2,pCutsR[(long)(int)Value2 + -1],
                                          p->pPars->nLutSize);
              if ((iVar6 != 0) &&
                 (iVar6 = Lf_SetLastCutIsContained((Lf_Cut_t **)&pObj,(int)Value2), iVar6 == 0)) {
                p->CutCount[2] = p->CutCount[2] + 1.0;
                if ((p->pPars->fCutMin != 0) &&
                   (iVar6 = Lf_CutComputeTruthMux
                                      (p,pCut1,pCut2,_nCuts2,iVar2,fCompl1,iVar5,
                                       pCutsR[(long)(int)Value2 + -1]), iVar6 != 0)) {
                  wVar10 = Lf_CutGetSign(pCutsR[(long)(int)Value2 + -1]);
                  pCutsR[(long)(int)Value2 + -1]->Sign = wVar10;
                }
                Lf_CutParams(p,pCutsR[(long)(int)Value2 + -1],nCutNum,FlowRefs_00,pObj_00);
                Value2 = (float)Lf_SetAddCut((Lf_Cut_t **)&pObj,(int)Value2,nCutNum_00);
              }
            }
            pCut2 = Lf_CutNext(pCut2,n_00);
          }
        }
        pCut1 = Lf_CutNext(pCut1,n_00);
      }
    }
  }
  if (((int)Value2 < 1) || (nCutNum_00 <= (int)Value2)) {
    __assert_fail("nCutsR > 0 && nCutsR < nCutNum",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                  ,0x536,"void Lf_ObjMergeOrder(Lf_Man_t *, int)");
  }
  if ((Value2 != 1.4013e-45) && (pCutsR[0]->Delay < (int)pObj->Value)) {
    __assert_fail("nCutsR == 1 || pCutsR[0]->Delay <= pCutsR[1]->Delay",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                  ,0x539,"void Lf_ObjMergeOrder(Lf_Man_t *, int)");
  }
  p_00->Cut[1] = (Lf_Plc_t)((uint)p_00->Cut[1] & 0xfffffffe);
  p_00->Cut[0] = (Lf_Plc_t)((uint)p_00->Cut[0] & 0xfffffffe);
  uVar7 = Lf_MemSaveCut(&p->vStoreNew,(Lf_Cut_t *)pObj,CutSet[0x1f][9]._4_4_);
  p_00->Cut[1] = (Lf_Plc_t)((uint)p_00->Cut[1] & 1 | (uVar7 & 0x7fffffff) << 1);
  p_00->Cut[0] = (Lf_Plc_t)((uint)p_00->Cut[0] & 1 | (uVar7 & 0x7fffffff) << 1);
  uVar7 = pObj->Value;
  p_00->Delay[1] = uVar7;
  p_00->Delay[0] = uVar7;
  fVar1 = *(float *)(pObj + 1);
  p_00->Flow[1] = fVar1;
  p_00->Flow[0] = fVar1;
  uVar7 = pObj[1].Value >> 0x18;
  p->nCutCounts[uVar7] = p->nCutCounts[uVar7] + 1;
  p->CutCount[3] = (double)(int)Value2 + p->CutCount[3];
  p->nCutEqual = p->nCutEqual + 1;
  Value1 = 0.0;
  if ((1 < (int)Value2) && (pCutsR[0]->Flow + 0.005 < *(float *)(pObj + 1))) {
    iVar2 = Lf_MemSaveCut(&p->vStoreNew,pCutsR[0],CutSet[0x1f][9]._4_4_);
    p_00->Cut[1] = (Lf_Plc_t)((uint)p_00->Cut[1] & 1 | iVar2 << 1);
    p_00->Delay[1] = pCutsR[0]->Delay;
    p_00->Flow[1] = pCutsR[0]->Flow;
    uVar7 = *(uint *)&pCutsR[0]->field_0x14 >> 0x18;
    p->nCutCounts[uVar7] = p->nCutCounts[uVar7] + 1;
    p->nCutEqual = p->nCutEqual + -1;
    Value1 = (float)(uint)((*(uint *)&pCutsR[0]->field_0x14 >> 0x16 & 1) == 0);
  }
  if ((p->pPars->fUseMux7 != 0) &&
     (iVar2 = Gia_ObjIsMuxId(p->pGia,CutSet[0x1f][9]._4_4_), iVar2 != 0)) {
    pCut = Lf_ObjCutMux(p,CutSet[0x1f][9]._4_4_);
    Lf_CutParams(p,pCut,nCutNum,FlowRefs_00,pObj_00);
    p_00->Delay[2] = pCut->Delay;
    p_00->Flow[2] = pCut->Flow;
  }
  if (p->fUseEla != 0) {
    p_00->Cut[(int)Value1] = (Lf_Plc_t)((uint)p_00->Cut[(int)Value1] & 0xfffffffe | 1);
    iVar2 = Lf_ObjMapRefNum(p,CutSet[0x1f][9]._4_4_);
    if (0 < iVar2) {
      Lf_CutRef_rec(p,pCutsR[(long)(int)Value1 + -1]);
    }
  }
  if (pObj_00->Value != 0) {
    pCut1 = Lf_ManFetchSet(p,CutSet[0x1f][9]._4_4_);
    for (n = 0; n < nCutNum_00; n = n + 1) {
      if ((*(uint *)&pCut1->field_0x14 >> 0x17 & 1) != 0) {
        __assert_fail("!pCut0->fMux7",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                      ,0x56a,"void Lf_ObjMergeOrder(Lf_Man_t *, int)");
      }
      if (n < (int)Value2) {
        Lf_CutCopy(pCut1,pCutsR[(long)n + -1],n_00);
      }
      else if ((((float)n == Value2) && (1 < pObj[1].Value >> 0x18)) &&
              ((Value2 == 1.4013e-45 || (1 < *(uint *)&pCutsR[0]->field_0x14 >> 0x18)))) {
        Lf_CutCreateUnit(pCut1,CutSet[0x1f][9]._4_4_);
      }
      else {
        *(uint *)&pCut1->field_0x14 = *(uint *)&pCut1->field_0x14 & 0xffffff | 0xff000000;
      }
      pCut1 = Lf_CutNext(pCut1,n_00);
    }
  }
  return;
}

Assistant:

void Lf_ObjMergeOrder( Lf_Man_t * p, int iObj )
{
    word CutSet[LF_CUT_MAX][LF_CUT_WORDS] = {{0}};
    Lf_Cut_t * pCutSet0, * pCutSet1, * pCutSet2, * pCut0, * pCut1, * pCut2;
    Lf_Cut_t * pCutSet = (Lf_Cut_t *)CutSet, * pCutsR[LF_CUT_MAX];
    Gia_Obj_t * pObj = Gia_ManObj(p->pGia, iObj);
    Lf_Bst_t * pBest = Lf_ObjReadBest(p, iObj);
    float FlowRefs = Lf_ObjFlowRefs(p, iObj);
    int Required   = Lf_ObjRequired(p, iObj);
    int nLutSize   = p->pPars->fCutGroup ? p->pPars->nLutSize/2 : p->pPars->nLutSize;
    int nCutNum    = p->pPars->nCutNum;
    int nCutWords  = p->nCutWords;
    int fComp0     = Gia_ObjFaninC0(pObj);
    int fComp1     = Gia_ObjFaninC1(pObj);
    int nCuts0     = Lf_ManPrepareSet( p, Gia_ObjFaninId0(pObj, iObj), 0, &pCutSet0 );
    int nCuts1     = Lf_ManPrepareSet( p, Gia_ObjFaninId1(pObj, iObj), 1, &pCutSet1 );
    int iSibl      = Gia_ObjSibl(p->pGia, iObj);
    int i, k, n, iCutUsed, nCutsR = 0;
    float Value1 = -1, Value2 = -1;
    assert( !Gia_ObjIsBuf(pObj) );
    Lf_CutSetForEachCut( nCutWords, pCutSet, pCut0, i, nCutNum )
        pCutsR[i] = pCut0;
    if ( p->Iter )
    {
        assert( nCutsR == 0 );
        // load cuts
        Lf_MemLoadCut( &p->vStoreOld, pBest->Cut[0].Handle, iObj, pCutsR[0], p->pPars->fCutMin, 1 );
        if ( Lf_BestDiffCuts(pBest) )
            Lf_MemLoadCut( &p->vStoreOld, pBest->Cut[1].Handle, iObj, pCutsR[1], p->pPars->fCutMin, 1 );
        // deref the cut
        if ( p->fUseEla && Lf_ObjMapRefNum(p, iObj) > 0 )
            Value1 = Lf_CutDeref_rec( p, pCutsR[Lf_BestIndex(pBest)] );
        // update required times
        if ( Required == ABC_INFINITY )//&& !p->fUseEla )
            Required = Lf_CutRequired( p, pCutsR[0] );
        // compute parameters
        Lf_CutParams( p, pCutsR[nCutsR++], Required, FlowRefs, pObj );
        if ( Lf_BestDiffCuts(pBest) )
        {
            assert( nCutsR == 1 );
            Lf_CutParams( p, pCutsR[nCutsR], Required, FlowRefs, pObj );
            nCutsR = Lf_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
        if ( pCutsR[0]->fLate )
            p->nTimeFails++;
    }
    if ( iSibl )
    {
        Gia_Obj_t * pObjE = Gia_ObjSiblObj(p->pGia, iObj);
        int fCompE = Gia_ObjPhase(pObj) ^ Gia_ObjPhase(pObjE);
        int nCutsE = Lf_ManPrepareSet( p, iSibl, 2, &pCutSet2 );
        Lf_CutSetForEachCut( nCutWords, pCutSet2, pCut2, n, nCutsE )
        {
            if ( pCut2->pLeaves[0] == iSibl )
                continue;
            Lf_CutCopy( pCutsR[nCutsR], pCut2, nCutWords );
            if ( pCutsR[nCutsR]->iFunc >= 0 )
                pCutsR[nCutsR]->iFunc = Abc_LitNotCond( pCutsR[nCutsR]->iFunc, fCompE );
            Lf_CutParams( p, pCutsR[nCutsR], Required, FlowRefs, pObj );
            nCutsR = Lf_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
    }
    if ( Gia_ObjIsMuxId(p->pGia, iObj) )
    {
        Lf_Cut_t * pCutSave = NULL;
        int fComp2 = Gia_ObjFaninC2(p->pGia, pObj);
        int nCuts2 = Lf_ManPrepareSet( p, Gia_ObjFaninId2(p->pGia, iObj), 2, &pCutSet2 );
        p->CutCount[0] += nCuts0 * nCuts1 * nCuts2;
        Lf_CutSetForEachCut( nCutWords, pCutSet0, pCut0, i, nCuts0 ) if ( (int)pCut0->nLeaves <= nLutSize )
        Lf_CutSetForEachCut( nCutWords, pCutSet1, pCut1, k, nCuts1 ) if ( (int)pCut1->nLeaves <= nLutSize )
        Lf_CutSetForEachCut( nCutWords, pCutSet2, pCut2, n, nCuts2 ) if ( (int)pCut2->nLeaves <= nLutSize )
        {
            pCutSave = pCut2;
            if ( Lf_CutCountBits(pCut0->Sign | pCut1->Sign | pCut2->Sign) > nLutSize )
                continue;
            p->CutCount[1]++; 
            if ( !Lf_CutMergeOrderMux(pCut0, pCut1, pCut2, pCutsR[nCutsR], nLutSize) )
                continue;
            if ( Lf_SetLastCutIsContained(pCutsR, nCutsR) )
                continue;
            p->CutCount[2]++;
            if ( p->pPars->fCutMin && Lf_CutComputeTruthMux(p, pCut0, pCut1, pCut2, fComp0, fComp1, fComp2, pCutsR[nCutsR]) )
                pCutsR[nCutsR]->Sign = Lf_CutGetSign(pCutsR[nCutsR]);
            if ( p->pPars->nLutSizeMux && p->pPars->nLutSizeMux == (int)pCutsR[nCutsR]->nLeaves && 
                Lf_ManFindCofVar(Lf_CutTruth(p,pCutsR[nCutsR]), Abc_Truth6WordNum(nLutSize), pCutsR[nCutsR]->nLeaves) == -1 )
                continue;
            Lf_CutParams( p, pCutsR[nCutsR], Required, FlowRefs, pObj );
            nCutsR = Lf_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
        if ( p->pPars->fCutGroup )
        {
            assert( pCutSave->nLeaves == 1 );
            assert( pCutSave->pLeaves[0] == Gia_ObjFaninId2(p->pGia, iObj) );
            Lf_CutSetForEachCut( nCutWords, pCutSet0, pCut0, i, nCuts0 ) if ( (int)pCut0->nLeaves <= nLutSize )
            Lf_CutSetForEachCut( nCutWords, pCutSet1, pCut1, k, nCuts1 ) if ( (int)pCut1->nLeaves <= nLutSize )
            {
                assert( (int)pCut0->nLeaves + (int)pCut1->nLeaves + 1 <= p->pPars->nLutSize );
    //            if ( Lf_CutCountBits(pCut0->Sign | pCut1->Sign | pCutSave->Sign) > p->pPars->nLutSize )
    //                continue;
                p->CutCount[1]++; 
                if ( !Lf_CutMergeOrderMux(pCut0, pCut1, pCutSave, pCutsR[nCutsR], p->pPars->nLutSize) )
                    continue;
                if ( Lf_SetLastCutIsContained(pCutsR, nCutsR) )
                    continue;
                p->CutCount[2]++;
                if ( p->pPars->fCutMin && Lf_CutComputeTruthMux(p, pCut0, pCut1, pCutSave, fComp0, fComp1, fComp2, pCutsR[nCutsR]) )
                    pCutsR[nCutsR]->Sign = Lf_CutGetSign(pCutsR[nCutsR]);
    //            if ( p->pPars->nLutSizeMux && p->pPars->nLutSizeMux == (int)pCutsR[nCutsR]->nLeaves && 
    //                Lf_ManFindCofVar(Lf_CutTruth(p,pCutsR[nCutsR]), Abc_Truth6WordNum(nLutSize), pCutsR[nCutsR]->nLeaves) == -1 )
    //                continue;
                Lf_CutParams( p, pCutsR[nCutsR], Required, FlowRefs, pObj );
                nCutsR = Lf_SetAddCut( pCutsR, nCutsR, nCutNum );
            }
        }
    }
    else
    {
        int fIsXor = Gia_ObjIsXor(pObj);
        p->CutCount[0] += nCuts0 * nCuts1;
        Lf_CutSetForEachCut( nCutWords, pCutSet0, pCut0, i, nCuts0 ) if ( (int)pCut0->nLeaves <= nLutSize )
        Lf_CutSetForEachCut( nCutWords, pCutSet1, pCut1, k, nCuts1 ) if ( (int)pCut1->nLeaves <= nLutSize )
        {
            if ( (int)(pCut0->nLeaves + pCut1->nLeaves) > nLutSize && Lf_CutCountBits(pCut0->Sign | pCut1->Sign) > nLutSize )
                continue;
            p->CutCount[1]++; 
            if ( !Lf_CutMergeOrder(pCut0, pCut1, pCutsR[nCutsR], nLutSize) )
                continue;
            if ( Lf_SetLastCutIsContained(pCutsR, nCutsR) )
                continue;
            p->CutCount[2]++;
            if ( p->pPars->fCutMin && Lf_CutComputeTruth(p, pCut0, pCut1, fComp0, fComp1, pCutsR[nCutsR], fIsXor) )
                pCutsR[nCutsR]->Sign = Lf_CutGetSign(pCutsR[nCutsR]);
            if ( p->pPars->nLutSizeMux && p->pPars->nLutSizeMux == (int)pCutsR[nCutsR]->nLeaves && 
                Lf_ManFindCofVar(Lf_CutTruth(p,pCutsR[nCutsR]), Abc_Truth6WordNum(nLutSize), pCutsR[nCutsR]->nLeaves) == -1 )
                continue;
            Lf_CutParams( p, pCutsR[nCutsR], Required, FlowRefs, pObj );
            nCutsR = Lf_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
    }
    // debug printout
    if ( 0 )
    {
        printf( "*** Obj = %d  FlowRefs = %.2f  MapRefs = %2d  Required = %2d\n", iObj, FlowRefs, Lf_ObjMapRefNum(p, iObj), Required );
        for ( i = 0; i < nCutsR; i++ )
            Lf_CutPrint( p, pCutsR[i] );
        printf( "\n" );
    }
    // verify
    assert( nCutsR > 0 && nCutsR < nCutNum );
//    assert( Lf_SetCheckArray(pCutsR, nCutsR) );
    // delay cut
    assert( nCutsR == 1 || pCutsR[0]->Delay <= pCutsR[1]->Delay );
    pBest->Cut[0].fUsed = pBest->Cut[1].fUsed = 0;
    pBest->Cut[0].Handle = pBest->Cut[1].Handle = Lf_MemSaveCut(&p->vStoreNew, pCutsR[0], iObj);
    pBest->Delay[0] = pBest->Delay[1] = pCutsR[0]->Delay;
    pBest->Flow[0] = pBest->Flow[1] = pCutsR[0]->Flow;
    p->nCutCounts[pCutsR[0]->nLeaves]++;
    p->CutCount[3] += nCutsR;
    p->nCutEqual++;
    // area cut
    iCutUsed = 0;
    if ( nCutsR > 1 && pCutsR[0]->Flow > pCutsR[1]->Flow + LF_EPSILON )//&& !pCutsR[1]->fLate ) // can remove !fLate
    {
        pBest->Cut[1].Handle = Lf_MemSaveCut(&p->vStoreNew, pCutsR[1], iObj);
        pBest->Delay[1] = pCutsR[1]->Delay;
        pBest->Flow[1] = pCutsR[1]->Flow;
        p->nCutCounts[pCutsR[1]->nLeaves]++;
        p->nCutEqual--;
        if ( !pCutsR[1]->fLate )
            iCutUsed = 1;
    }
    // mux cut
    if ( p->pPars->fUseMux7 && Gia_ObjIsMuxId(p->pGia, iObj) )
    {
        pCut2 = Lf_ObjCutMux( p, iObj );
        Lf_CutParams( p, pCut2, Required, FlowRefs, pObj );
        pBest->Delay[2] = pCut2->Delay;
        pBest->Flow[2] = pCut2->Flow;
        // update area value of the best area cut
//        if ( !pCut2->fLate )
//            pBest->Flow[1] = Abc_MinFloat( pBest->Flow[1], pBest->Flow[2] );
    }
    // reference resulting cut
    if ( p->fUseEla )
    {
        pBest->Cut[iCutUsed].fUsed = 1;
        if ( Lf_ObjMapRefNum(p, iObj) > 0 )
            Value2 = Lf_CutRef_rec( p, pCutsR[iCutUsed] );
//        if ( Value1 < Value2 )
//            printf( "ELA degradated cost at node %d from %d to %d.\n", iObj, Value1, Value2 ), fflush(stdout);
//        assert( Value1 >= Value2 );
//        if ( Value1 != -1 )
//            printf( "%.2f -> %.2f    ", Value1, Value2 );
    }
    if ( pObj->Value == 0 )
        return;
    // store the cutset
    pCutSet = Lf_ManFetchSet(p, iObj);
    Lf_CutSetForEachCut( nCutWords, pCutSet, pCut0, i, nCutNum )
    {
        assert( !pCut0->fMux7 );
        if ( i < nCutsR )
            Lf_CutCopy( pCut0, pCutsR[i], nCutWords );
        else if ( i == nCutsR && pCutsR[0]->nLeaves > 1 && (nCutsR == 1 || pCutsR[1]->nLeaves > 1) )
            Lf_CutCreateUnit( pCut0, iObj );
        else
            pCut0->nLeaves = LF_NO_LEAF;
    }
}